

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::writeAnchorVolumeDescriptor(IsoWriter *this,uint32_t endPartitionAddr)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  size_t in_RCX;
  uint32_t *buff32;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x02';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  this->m_buffer[0x10] = '\0';
  this->m_buffer[0x11] = 0x80;
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = ' ';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  this->m_buffer[0x18] = '\0';
  this->m_buffer[0x19] = 0x80;
  this->m_buffer[0x1a] = '\0';
  this->m_buffer[0x1b] = '\0';
  *(uint32_t *)(this->m_buffer + 0x1c) = endPartitionAddr;
  anon_unknown.dwarf_cd2a3::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,in_RCX);
  return;
}

Assistant:

void IsoWriter::writeAnchorVolumeDescriptor(const uint32_t endPartitionAddr)
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::AnchorVolPtr, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    buff32[4] = 0x8000;  // point of the main volume descriptor
    buff32[5] = 0x20;
    buff32[6] = 0x8000;
    buff32[7] = endPartitionAddr;  // set size to allocated sectors amount

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}